

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase54::run(TestCase54 *this)

{
  Reader reader_00;
  Reader reader_01;
  Builder builder_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  SegmentArrayMessageReader reader;
  MallocMessageBuilder builder;
  PointerReader local_2d8;
  Reader local_2b8;
  StructBuilder local_298;
  StructBuilder local_270;
  StructReader local_248;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 in_stack_fffffffffffffe10;
  WirePointer *in_stack_fffffffffffffe30;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_2d8,&local_f8.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_270,(PointerBuilder *)&stack0xfffffffffffffe18,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)local_2d8.segment;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10;
  builder_00._builder.data = local_2d8.capTable;
  builder_00._builder.pointers = local_2d8.pointer;
  builder_00._builder._32_8_ = in_stack_fffffffffffffe30;
  initTestMessage(builder_00);
  MessageBuilder::getRootInternal((Builder *)&local_2d8,&local_f8.super_MessageBuilder);
  PointerBuilder::getStruct
            (&local_298,(PointerBuilder *)&stack0xfffffffffffffe18,(StructSize)0x140006,(word *)0x0)
  ;
  checkTestMessage((Builder)builder.super_MessageBuilder._0_40_);
  MessageBuilder::getRootInternal((Builder *)&local_2b8,&local_f8.super_MessageBuilder);
  local_2d8.pointer = local_2b8.reader.pointer;
  local_2d8.segment = local_2b8.reader.segment;
  local_2d8.capTable = local_2b8.reader.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffe18,(PointerBuilder *)&local_2d8,
             (StructSize)0x140006,(word *)0x0);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffe18);
  reader_00._reader.capTable = (CapTableReader *)uStack_210;
  reader_00._reader.segment = (SegmentReader *)local_218;
  reader_00._reader.data = (void *)local_208;
  reader_00._reader.pointers = (WirePointer *)uStack_200;
  reader_00._reader.dataSize = (undefined4)local_1f8;
  reader_00._reader.pointerCount = local_1f8._4_2_;
  reader_00._reader._38_2_ = local_1f8._6_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffe10;
  checkTestMessage(reader_00);
  segments = MessageBuilder::getSegmentsForOutput(&local_f8.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)&stack0xfffffffffffffe18,segments,options);
  MessageReader::getRootInternal(&local_2b8,(MessageReader *)&stack0xfffffffffffffe18);
  local_2d8.pointer = local_2b8.reader.pointer;
  local_2d8.nestingLimit = local_2b8.reader.nestingLimit;
  local_2d8._28_4_ = local_2b8.reader._28_4_;
  local_2d8.segment = local_2b8.reader.segment;
  local_2d8.capTable = local_2b8.reader.capTable;
  PointerReader::getStruct(&local_248,&local_2d8,(word *)0x0);
  reader_01._reader.capTable = local_248.capTable;
  reader_01._reader.segment = local_248.segment;
  reader_01._reader.data = local_248.data;
  reader_01._reader.pointers = local_248.pointers;
  reader_01._reader.dataSize = local_248.dataSize;
  reader_01._reader.pointerCount = local_248.pointerCount;
  reader_01._reader._38_2_ = local_248._38_2_;
  reader_01._reader.nestingLimit = local_248.nestingLimit;
  reader_01._reader._44_4_ = local_248._44_4_;
  checkTestMessage(reader_01);
  SegmentArrayMessageReader::~SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)&stack0xfffffffffffffe18);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Endian, TwoBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint16_t>* vals = reinterpret_cast<WireValue<uint16_t>*>(bytes);

  EXPECT_EQ(0x3412, vals[0].get());
  EXPECT_EQ(0x7856, vals[1].get());

  vals[0].set(0x2345);
  vals[1].set(0x6789);

  EXPECT_EQ(0x45, bytes[0]);
  EXPECT_EQ(0x23, bytes[1]);
  EXPECT_EQ(0x89, bytes[2]);
  EXPECT_EQ(0x67, bytes[3]);
}